

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

void HTS_gc2gc(HTS_Vocoder *v,double *c1,int m1,double g1,double *c2,int m2,double g2)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  uVar6 = (ulong)m1;
  if (v->gc2gc_size < uVar6) {
    if (v->gc2gc_buff != (double *)0x0) {
      HTS_free(v->gc2gc_buff);
    }
    pdVar2 = (double *)HTS_calloc((long)(m1 + 1),8);
    v->gc2gc_buff = pdVar2;
    v->gc2gc_size = uVar6;
  }
  pdVar2 = v->gc2gc_buff;
  iVar1 = m1 + 1;
  lVar3 = (long)iVar1;
  if (pdVar2 < c1) {
    if (iVar1 != 0) {
      lVar5 = 0;
      do {
        pdVar2[lVar5] = c1[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar3 != lVar5);
    }
  }
  else if (iVar1 != 0) {
    do {
      pdVar2[lVar3 + -1] = c1[lVar3 + -1];
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  *c2 = *pdVar2;
  if (0 < m2) {
    uVar4 = 1;
    lVar3 = 0;
    do {
      iVar1 = (int)uVar4;
      iVar7 = iVar1 + -1;
      if ((long)uVar6 < (long)uVar4) {
        iVar7 = m1;
      }
      if (iVar7 < 1) {
        dVar9 = 0.0;
        dVar10 = 0.0;
      }
      else {
        dVar9 = 0.0;
        dVar10 = 0.0;
        uVar8 = 1;
        lVar5 = lVar3;
        do {
          dVar9 = dVar9 + pdVar2[uVar8] * c2[lVar5] * (double)(int)lVar5;
          dVar10 = dVar10 + pdVar2[uVar8] * c2[lVar5] * (double)(int)uVar8;
          uVar8 = uVar8 + 1;
          lVar5 = lVar5 + -1;
        } while (iVar7 + 1 != uVar8);
      }
      if ((long)uVar6 < (long)uVar4) {
        dVar9 = (dVar10 * g2 - dVar9 * g1) / (double)iVar1;
      }
      else {
        dVar9 = (dVar10 * g2 - dVar9 * g1) / (double)iVar1 + pdVar2[uVar4];
      }
      c2[uVar4] = dVar9;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 1;
    } while (uVar4 != m2 + 1);
  }
  return;
}

Assistant:

static void HTS_gc2gc(HTS_Vocoder * v, double *c1, const int m1, const double g1, double *c2, const int m2, const double g2)
{
   int i, min, k, mk;
   double ss1, ss2, cc;

   if (m1 > v->gc2gc_size) {
      if (v->gc2gc_buff != NULL)
         HTS_free(v->gc2gc_buff);
      v->gc2gc_buff = (double *) HTS_calloc(m1 + 1, sizeof(double));
      v->gc2gc_size = m1;
   }

   HTS_movem(c1, v->gc2gc_buff, m1 + 1);

   c2[0] = v->gc2gc_buff[0];
   for (i = 1; i <= m2; i++) {
      ss1 = ss2 = 0.0;
      min = m1 < i ? m1 : i - 1;
      for (k = 1; k <= min; k++) {
         mk = i - k;
         cc = v->gc2gc_buff[k] * c2[mk];
         ss2 += k * cc;
         ss1 += mk * cc;
      }

      if (i <= m1)
         c2[i] = v->gc2gc_buff[i] + (g2 * ss2 - g1 * ss1) / i;
      else
         c2[i] = (g2 * ss2 - g1 * ss1) / i;
   }
}